

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O1

_Bool bson_append_maxkey(bson_t *bson,char *key,int key_length)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  time_t tVar4;
  uint8_t *puVar5;
  undefined8 *puVar6;
  long *in_RCX;
  int extraout_EDX;
  int key_length_00;
  int key_length_01;
  uint key_length_02;
  int key_length_03;
  char *unaff_RBX;
  bson_t abStack_180 [2];
  char *pcStack_80;
  
  if (bson == (bson_t *)0x0) {
    bson_append_maxkey_cold_2();
  }
  else {
    unaff_RBX = key;
    if (key != (char *)0x0) {
      if (key_length < 0) {
        sVar3 = strlen(key);
        key_length = (int)sVar3;
      }
      _Var1 = _bson_append(bson,3,key_length + 2,1,&bson_append_maxkey::type);
      return _Var1;
    }
  }
  bson_append_maxkey_cold_1();
  if (bson == (bson_t *)0x0) {
    bson_append_minkey_cold_2();
  }
  else {
    unaff_RBX = key;
    if (key != (char *)0x0) {
      iVar2 = extraout_EDX;
      if (extraout_EDX < 0) {
        sVar3 = strlen(key);
        iVar2 = (int)sVar3;
      }
      _Var1 = _bson_append(bson,3,iVar2 + 2,1,&bson_append_minkey::type);
      return _Var1;
    }
  }
  bson_append_minkey_cold_1();
  if (bson == (bson_t *)0x0) {
    bson_append_time_t_cold_2();
  }
  else if (key != (char *)0x0) {
    _Var1 = bson_append_date_time(bson,key,key_length_00,(long)in_RCX * 1000);
    return _Var1;
  }
  bson_append_time_t_cold_1();
  if (bson == (bson_t *)0x0) {
    bson_append_timeval_cold_3();
LAB_0010ccab:
    bson_append_timeval_cold_2();
  }
  else {
    if (key == (char *)0x0) goto LAB_0010ccab;
    if (in_RCX != (long *)0x0) {
      _Var1 = bson_append_date_time(bson,key,key_length_01,*in_RCX * 1000 + (ulong)in_RCX[1] / 1000)
      ;
      return _Var1;
    }
  }
  bson_append_timeval_cold_1();
  if (bson == (bson_t *)0x0) {
    bson_append_now_utc_cold_3();
LAB_0010ccf6:
    bson_append_now_utc_cold_2();
  }
  else {
    if (key == (char *)0x0) goto LAB_0010ccf6;
    unaff_RBX = (char *)(ulong)key_length_02;
    if (-2 < (int)key_length_02) {
      tVar4 = time((time_t *)0x0);
      _Var1 = bson_append_date_time(bson,key,key_length_02,tVar4 * 1000);
      return _Var1;
    }
  }
  bson_append_now_utc_cold_1();
  pcStack_80 = unaff_RBX;
  if (bson == (bson_t *)0x0) {
    bson_append_value_cold_3();
LAB_0010cfba:
    bson_append_value_cold_2();
LAB_0010cfbf:
    bson_append_value_cold_1();
    if (bson != (bson_t *)0x0) {
      bson->flags = 3;
      bson->len = 5;
      bson->padding[0] = '\x05';
      bson->padding[1] = '\0';
      bson->padding[2] = '\0';
      bson->padding[3] = '\0';
      bson->padding[4] = '\0';
      return true;
    }
    bson_init_cold_1();
    if (bson != (bson_t *)0x0) {
      if ((bson->flags & 1) == 0) {
        puVar5 = (uint8_t *)(**(long **)(bson->padding + 0x10) + *(long *)(bson->padding + 0x20));
      }
      else {
        puVar5 = bson->padding;
      }
      bson->len = 5;
      *puVar5 = '\x05';
      puVar5[1] = '\0';
      puVar5[2] = '\0';
      puVar5[3] = '\0';
      puVar5[4] = '\0';
      return SUB81(puVar5,0);
    }
    bson_reinit_cold_1();
    puVar6 = (undefined8 *)bson_malloc(0x80);
    *puVar6 = 0x500000001;
    *(undefined1 *)(puVar6 + 1) = 5;
    *(undefined4 *)((long)puVar6 + 9) = 0;
    return SUB81(puVar6,0);
  }
  if (key == (char *)0x0) goto LAB_0010cfba;
  if (in_RCX == (long *)0x0) goto LAB_0010cfbf;
  iVar2 = (int)*in_RCX;
  switch(iVar2) {
  case 1:
    _Var1 = bson_append_double(bson,key,key_length_03,(double)in_RCX[1]);
    break;
  case 2:
    _Var1 = bson_append_utf8(bson,key,key_length_03,(char *)in_RCX[1],(int)in_RCX[2]);
    break;
  case 3:
    _Var1 = bson_init_static(abStack_180,(uint8_t *)in_RCX[1],(ulong)*(uint *)(in_RCX + 2));
    if (_Var1) {
      _Var1 = bson_append_document(bson,key,key_length_03,abStack_180);
LAB_0010ceb7:
      bson_destroy(abStack_180);
      return _Var1;
    }
    goto LAB_0010cec3;
  case 4:
    _Var1 = bson_init_static(abStack_180,(uint8_t *)in_RCX[1],(ulong)*(uint *)(in_RCX + 2));
    if (_Var1) {
      _Var1 = bson_append_array(bson,key,key_length_03,abStack_180);
      goto LAB_0010ceb7;
    }
    goto LAB_0010cec3;
  case 5:
    _Var1 = bson_append_binary(bson,key,key_length_03,*(bson_subtype_t *)((long)in_RCX + 0x14),
                               (uint8_t *)in_RCX[1],*(uint32_t *)(in_RCX + 2));
    break;
  case 6:
    _Var1 = bson_append_undefined(bson,key,key_length_03);
    break;
  case 7:
    _Var1 = bson_append_oid(bson,key,key_length_03,(bson_oid_t *)(in_RCX + 1));
    break;
  case 8:
    _Var1 = bson_append_bool(bson,key,key_length_03,SUB81(in_RCX[1],0));
    break;
  case 9:
    _Var1 = bson_append_date_time(bson,key,key_length_03,in_RCX[1]);
    break;
  case 10:
    _Var1 = bson_append_null(bson,key,key_length_03);
    break;
  case 0xb:
    _Var1 = bson_append_regex(bson,key,key_length_03,(char *)in_RCX[1],(char *)in_RCX[2]);
    break;
  case 0xc:
    _Var1 = bson_append_dbpointer
                      (bson,key,key_length_03,(char *)in_RCX[1],(bson_oid_t *)((long)in_RCX + 0x14))
    ;
    break;
  case 0xd:
    _Var1 = bson_append_code(bson,key,key_length_03,(char *)in_RCX[1]);
    break;
  case 0xe:
    _Var1 = bson_append_symbol(bson,key,key_length_03,(char *)in_RCX[1],(int)in_RCX[2]);
    break;
  case 0xf:
    _Var1 = bson_init_static(abStack_180,(uint8_t *)in_RCX[2],(ulong)*(uint *)((long)in_RCX + 0x1c))
    ;
    if (_Var1) {
      _Var1 = bson_append_code_with_scope(bson,key,key_length_03,(char *)in_RCX[1],abStack_180);
      goto LAB_0010ceb7;
    }
    goto LAB_0010cec3;
  case 0x10:
    _Var1 = bson_append_int32(bson,key,key_length_03,(int32_t)in_RCX[1]);
    break;
  case 0x11:
    _Var1 = bson_append_timestamp
                      (bson,key,key_length_03,*(uint32_t *)(in_RCX + 1),
                       *(uint32_t *)((long)in_RCX + 0xc));
    break;
  case 0x12:
    _Var1 = bson_append_int64(bson,key,key_length_03,in_RCX[1]);
    break;
  case 0x13:
    _Var1 = bson_append_decimal128(bson,key,key_length_03,(bson_decimal128_t *)(in_RCX + 1));
    break;
  default:
    if (iVar2 == 0x7f) {
      _Var1 = bson_append_maxkey(bson,key,key_length_03);
      return _Var1;
    }
    if (iVar2 == 0xff) {
      _Var1 = bson_append_minkey(bson,key,key_length_03);
      return _Var1;
    }
LAB_0010cec3:
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool
bson_append_maxkey (bson_t *bson, const char *key, int key_length)
{
   static const uint8_t type = BSON_TYPE_MAXKEY;

   BSON_ASSERT (bson);
   BSON_ASSERT (key);

   if (key_length < 0) {
      key_length = (int) strlen (key);
   }

   return _bson_append (
      bson, 3, (1 + key_length + 1), 1, &type, key_length, key, 1, &gZero);
}